

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

void amrex::Copy<amrex::TagBox,void>
               (FabArray<amrex::TagBox> *dst,FabArray<amrex::TagBox> *src,int srccomp,int dstcomp,
               int numcomp,IntVect *nghost)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  Box local_164;
  FabArray<amrex::TagBox> *local_148;
  FabArray<amrex::TagBox> *local_140;
  IntVect *local_138;
  long local_130;
  long local_128;
  ulong local_120;
  ulong local_118;
  Array4<char> dstFab;
  Array4<const_char> srcFab;
  MFIter mfi;
  
  local_148 = dst;
  local_140 = src;
  MFIter::MFIter(&mfi,&dst->super_FabArrayBase,true);
  local_128 = (long)dstcomp;
  if (numcomp < 1) {
    numcomp = 0;
  }
  local_120 = (ulong)(uint)numcomp;
  local_130 = (long)srccomp;
  local_138 = nghost;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_164,&mfi,nghost);
    if ((((local_164.smallend.vect[0] <= local_164.bigend.vect[0]) &&
         (local_164.smallend.vect[1] <= local_164.bigend.vect[1])) &&
        (local_164.smallend.vect[2] <= local_164.bigend.vect[2])) && (local_164.btype.itype < 8)) {
      FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(&srcFab,local_140,&mfi);
      FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(&dstFab,local_148,&mfi);
      uVar1 = 0;
      while (uVar4 = uVar1, nghost = local_138, uVar4 != local_120) {
        for (iVar5 = local_164.smallend.vect[2]; iVar3 = local_164.smallend.vect[1],
            iVar5 <= local_164.bigend.vect[2]; iVar5 = iVar5 + 1) {
          for (; iVar3 <= local_164.bigend.vect[1]; iVar3 = iVar3 + 1) {
            iVar2 = local_164.smallend.vect[0];
            if (local_164.smallend.vect[0] <= local_164.bigend.vect[0]) {
              do {
                dstFab.p[dstFab.nstride * (uVar4 + local_128) +
                         ((long)iVar5 - (long)dstFab.begin.z) * dstFab.kstride +
                         (long)(iVar2 - dstFab.begin.x) +
                         ((long)iVar3 - (long)dstFab.begin.y) * dstFab.jstride] =
                     srcFab.p[srcFab.nstride * (uVar4 + local_130) +
                              ((long)iVar5 - (long)srcFab.begin.z) * srcFab.kstride +
                              (long)(iVar2 - srcFab.begin.x) +
                              ((long)iVar3 - (long)srcFab.begin.y) * srcFab.jstride];
                iVar2 = iVar2 + 1;
              } while (local_164.bigend.vect[0] + 1 != iVar2);
            }
          }
        }
        local_118 = uVar4;
        uVar1 = uVar4 + 1;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
Copy (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& srcarr = src.const_arrays();
        auto const& dstarr = dst.arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstarr[box_no](i,j,k,dstcomp+n) = srcarr[box_no](i,j,k,srccomp+n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,dstcomp+n) = srcFab(i,j,k,srccomp+n);
                });
            }
        }
    }
}